

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

void setTimeZoneFilesDir(char *path,UErrorCode *status)

{
  CharString *this;
  UBool UVar1;
  StringPiece s;
  undefined1 local_28 [12];
  UErrorCode *local_18;
  UErrorCode *status_local;
  char *path_local;
  
  local_18 = status;
  status_local = (UErrorCode *)path;
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    icu_63::CharString::clear(gTimeZoneFilesDirectory);
    this = gTimeZoneFilesDirectory;
    icu_63::StringPiece::StringPiece((StringPiece *)local_28,(char *)status_local);
    s._12_4_ = 0;
    s.ptr_ = (char *)local_28._0_8_;
    s.length_ = local_28._8_4_;
    icu_63::CharString::append(this,s,local_18);
  }
  return;
}

Assistant:

static void setTimeZoneFilesDir(const char *path, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return;
    }
    gTimeZoneFilesDirectory->clear();
    gTimeZoneFilesDirectory->append(path, status);
#if (U_FILE_SEP_CHAR != U_FILE_ALT_SEP_CHAR)
    char *p = gTimeZoneFilesDirectory->data();
    while ((p = uprv_strchr(p, U_FILE_ALT_SEP_CHAR)) != NULL) {
        *p = U_FILE_SEP_CHAR;
    }
#endif
}